

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

void __thiscall kj::MainBuilder::Impl::~Impl(Impl *this)

{
  _::NullableValue<kj::Function<kj::MainBuilder::Validity_()>_>::~NullableValue
            (&(this->finalCallback).ptr);
  ArrayBuilder<kj::MainBuilder::Impl::Arg>::dispose(&(this->args).builder);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
  ::~_Rb_tree(&(this->subCommands)._M_t);
  std::
  _Rb_tree<kj::ArrayPtr<const_char>,_std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>,_kj::MainBuilder::Impl::CharArrayCompare,_std::allocator<std::pair<const_kj::ArrayPtr<const_char>,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~_Rb_tree(&(this->longOptions)._M_t);
  std::
  _Rb_tree<char,_std::pair<const_char,_kj::MainBuilder::Impl::Option_*>,_std::_Select1st<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_kj::MainBuilder::Impl::Option_*>_>_>
  ::~_Rb_tree(&(this->shortOptions)._M_t);
  Arena::~Arena(&this->arena);
  return;
}

Assistant:

inline Impl(ProcessContext& context, StringPtr version,
              StringPtr briefDescription, StringPtr extendedDescription)
      : context(context), version(version),
        briefDescription(briefDescription), extendedDescription(extendedDescription) {}